

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2413.c
# Opt level: O1

void ym2413_reset_chip(void *chip)

{
  long lVar1;
  long lVar2;
  UINT8 CurIns;
  long lVar3;
  YM2413 *OPLL;
  uint r;
  UINT8 CurReg;
  long lVar4;
  
  *(undefined8 *)((long)chip + 0x690) = 0;
  *(undefined4 *)((long)chip + 0x6bc) = 1;
  lVar1 = *(long *)((long)chip + 0x6c8);
  lVar2 = (long)chip + 0x6d0;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined1 *)(lVar2 + lVar4) = *(undefined1 *)(lVar1 + lVar4);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 8;
    lVar1 = lVar1 + 8;
  } while (lVar3 != 0x13);
  r = 0x40;
  do {
    r = r - 1;
    OPLLWriteReg((YM2413 *)chip,r,0);
  } while (0x10 < r);
  lVar1 = (long)chip + 0x2d;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      *(undefined4 *)(lVar1 + 0x2b + lVar3) = 0;
      *(undefined1 *)(lVar1 + lVar3) = 0;
      *(undefined4 *)(lVar1 + 0xb + lVar3) = 0xff;
      lVar3 = lVar3 + 0x54;
    } while (lVar3 == 0x54);
    lVar2 = lVar2 + 1;
    lVar1 = lVar1 + 0xb8;
  } while (lVar2 != 9);
  return;
}

Assistant:

static void ym2413_reset_chip(void *chip)
{
	YM2413 *OPLL = (YM2413 *)chip;
	OPLLResetChip(OPLL);
}